

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

wostream * mjs::operator<<(wostream *os,declaration *d)

{
  expression *peVar1;
  wostream *pwVar2;
  
  std::operator<<(os,'{');
  pwVar2 = os;
  if ((d->id_)._M_string_length != 0) {
    std::operator<<(os,(wstring *)d);
    if ((d->init_)._M_t.
        super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
        super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
        super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == (expression *)0x0)
    goto LAB_0016a975;
    pwVar2 = std::operator<<(os,", ");
  }
  peVar1 = (d->init_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 0x10))(peVar1,pwVar2);
LAB_0016a975:
  pwVar2 = std::operator<<(os,'}');
  return pwVar2;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const declaration& d) {
        os << '{';
        if (!d.id_.empty()) {
            os << d.id_;
            if (d.init_) {
                os << ", " << *d.init_;
            }
        } else {
            os << *d.init_;
        }
        return os << '}';
    }